

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc.c
# Opt level: O0

void dumb_it_add_lpc(DUMB_IT_SIGDATA *sigdata)

{
  int iVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  long in_RDI;
  IT_SAMPLE *sample;
  int lpc_samples;
  int offset;
  int o;
  int n;
  short *s16;
  char *s8;
  float lpc_output [128];
  float lpc_input [512];
  float lpc [64];
  int local_b28;
  int local_b20;
  int local_b1c;
  float local_b08 [64];
  float afStack_a08 [64];
  float local_908 [256];
  float afStack_508 [256];
  float local_108 [32];
  float afStack_88 [32];
  long local_8;
  
  local_8 = in_RDI;
  for (local_b1c = 0; local_b1c < *(int *)(local_8 + 0x58); local_b1c = local_b1c + 1) {
    lVar2 = *(long *)(local_8 + 0x118) + (long)local_b1c * 0x68;
    if ((*(byte *)(lVar2 + 0x32) & 0x11) == 1) {
      if (*(int *)(lVar2 + 0x38) < 0x20) {
        iVar1 = *(int *)(lVar2 + 0x38);
        *(int *)(lVar2 + 0x38) = *(int *)(lVar2 + 0x38) + 0x40;
        local_b1c = 1;
        if ((*(byte *)(lVar2 + 0x32) & 4) != 0) {
          local_b1c = 2;
        }
        if ((*(byte *)(lVar2 + 0x32) & 2) != 0) {
          local_b1c = local_b1c << 1;
        }
        iVar1 = local_b1c * iVar1;
        pvVar4 = realloc(*(void **)(lVar2 + 0x58),(long)(iVar1 + local_b1c * 0x40));
        *(void **)(lVar2 + 0x58) = pvVar4;
        memset((void *)(*(long *)(lVar2 + 0x58) + (long)iVar1),0,(long)(local_b1c * 0x40));
      }
      else {
        local_b28 = *(int *)(lVar2 + 0x38);
        if (0x100 < local_b28) {
          local_b28 = 0x100;
        }
        iVar1 = *(int *)(lVar2 + 0x38) - local_b28;
        if ((*(byte *)(lVar2 + 0x32) & 4) == 0) {
          if ((*(byte *)(lVar2 + 0x32) & 2) == 0) {
            lVar3 = *(long *)(lVar2 + 0x58);
            for (local_b20 = 0; local_b20 < local_b28; local_b20 = local_b20 + 1) {
              local_908[local_b20] = (float)(int)*(char *)(lVar3 + iVar1 + (long)local_b20);
            }
          }
          else {
            lVar3 = *(long *)(lVar2 + 0x58);
            for (local_b20 = 0; local_b20 < local_b28; local_b20 = local_b20 + 1) {
              local_908[local_b20] =
                   (float)(int)*(short *)(lVar3 + (long)iVar1 * 2 + (long)local_b20 * 2);
            }
          }
          vorbis_lpc_from_data(local_908,local_108,local_b28,0x20);
          vorbis_lpc_predict(local_108,local_908 + (long)local_b28 + -0x20,0x20,local_b08,0x40);
          if ((*(byte *)(lVar2 + 0x32) & 2) == 0) {
            pvVar4 = realloc(*(void **)(lVar2 + 0x58),(long)(*(int *)(lVar2 + 0x38) + 0x40));
            *(void **)(lVar2 + 0x58) = pvVar4;
            iVar1 = *(int *)(lVar2 + 0x38);
            *(int *)(lVar2 + 0x38) = *(int *)(lVar2 + 0x38) + 0x40;
            for (local_b20 = 0; local_b20 < 0x40; local_b20 = local_b20 + 1) {
              *(char *)((long)pvVar4 + (long)local_b20 + (long)iVar1) =
                   (char)(int)local_b08[local_b20];
            }
          }
          else {
            pvVar4 = realloc(*(void **)(lVar2 + 0x58),(long)(*(int *)(lVar2 + 0x38) + 0x40) << 1);
            *(void **)(lVar2 + 0x58) = pvVar4;
            iVar1 = *(int *)(lVar2 + 0x38);
            *(int *)(lVar2 + 0x38) = *(int *)(lVar2 + 0x38) + 0x40;
            for (local_b20 = 0; local_b20 < 0x40; local_b20 = local_b20 + 1) {
              *(short *)((long)pvVar4 + (long)local_b20 * 2 + (long)iVar1 * 2) =
                   (short)(int)local_b08[local_b20];
            }
          }
        }
        else {
          if ((*(byte *)(lVar2 + 0x32) & 2) == 0) {
            lVar3 = *(long *)(lVar2 + 0x58) + (long)(iVar1 * 2);
            for (local_b20 = 0; local_b20 < local_b28; local_b20 = local_b20 + 1) {
              local_908[local_b20] = (float)(int)*(char *)(lVar3 + local_b20 * 2);
              local_908[local_b20 + 0x100] =
                   (float)(int)*(char *)(lVar3 + 1 + (long)(local_b20 * 2));
            }
          }
          else {
            lVar3 = *(long *)(lVar2 + 0x58) + (long)(iVar1 * 2) * 2;
            for (local_b20 = 0; local_b20 < local_b28; local_b20 = local_b20 + 1) {
              local_908[local_b20] = (float)(int)*(short *)(lVar3 + (long)(local_b20 * 2) * 2);
              local_908[local_b20 + 0x100] =
                   (float)(int)*(short *)(lVar3 + 2 + (long)(local_b20 * 2) * 2);
            }
          }
          vorbis_lpc_from_data(local_908,local_108,local_b28,0x20);
          vorbis_lpc_from_data(afStack_508,afStack_88,local_b28,0x20);
          vorbis_lpc_predict(local_108,local_908 + (long)local_b28 + -0x20,0x20,local_b08,0x40);
          vorbis_lpc_predict(afStack_88,afStack_508 + (long)local_b28 + -0x20,0x20,afStack_a08,0x40)
          ;
          if ((*(byte *)(lVar2 + 0x32) & 2) == 0) {
            pvVar4 = realloc(*(void **)(lVar2 + 0x58),(long)((*(int *)(lVar2 + 0x38) + 0x40) * 2));
            *(void **)(lVar2 + 0x58) = pvVar4;
            iVar1 = *(int *)(lVar2 + 0x38) << 1;
            *(int *)(lVar2 + 0x38) = *(int *)(lVar2 + 0x38) + 0x40;
            for (local_b20 = 0; local_b20 < 0x40; local_b20 = local_b20 + 1) {
              *(char *)((long)pvVar4 + (long)(local_b20 * 2) + (long)iVar1) =
                   (char)(int)local_b08[local_b20];
              *(char *)((long)pvVar4 + (long)(local_b20 * 2 + 1) + (long)iVar1) =
                   (char)(int)afStack_a08[local_b20];
            }
          }
          else {
            pvVar4 = realloc(*(void **)(lVar2 + 0x58),
                             (long)((*(int *)(lVar2 + 0x38) + 0x40) * 2) << 1);
            *(void **)(lVar2 + 0x58) = pvVar4;
            iVar1 = *(int *)(lVar2 + 0x38) << 1;
            *(int *)(lVar2 + 0x38) = *(int *)(lVar2 + 0x38) + 0x40;
            for (local_b20 = 0; local_b20 < 0x40; local_b20 = local_b20 + 1) {
              *(short *)((long)pvVar4 + (long)(local_b20 * 2) * 2 + (long)iVar1 * 2) =
                   (short)(int)local_b08[local_b20];
              *(short *)((long)pvVar4 + (long)(local_b20 * 2 + 1) * 2 + (long)iVar1 * 2) =
                   (short)(int)afStack_a08[local_b20];
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void dumb_it_add_lpc(struct DUMB_IT_SIGDATA *sigdata){
    float lpc[lpc_order * 2];
    float lpc_input[lpc_max * 2];
    float lpc_output[lpc_extra * 2];

    signed char * s8;
    signed short * s16;

    int n, o, offset, lpc_samples;

    for ( n = 0; n < sigdata->n_samples; n++ ) {
        IT_SAMPLE * sample = sigdata->sample + n;
        if ( ( sample->flags & ( IT_SAMPLE_EXISTS | IT_SAMPLE_LOOP) ) == IT_SAMPLE_EXISTS ) {
            /* If we have enough sample data to train the filter, use the filter to generate the padding */
            if ( sample->length >= lpc_order ) {
                lpc_samples = sample->length;
                if (lpc_samples > lpc_max) lpc_samples = lpc_max;
                offset = sample->length - lpc_samples;

                if ( sample->flags & IT_SAMPLE_STEREO )
                {
                    if ( sample->flags & IT_SAMPLE_16BIT )
                    {
                        s16 = ( signed short * ) sample->data;
                        s16 += offset * 2;
                        for ( o = 0; o < lpc_samples; o++ )
                        {
                            lpc_input[ o ] = s16[ o * 2 + 0 ];
                            lpc_input[ o + lpc_max ] = s16[ o * 2 + 1 ];
                        }
                    }
                    else
                    {
                        s8 = ( signed char * ) sample->data;
                        s8 += offset * 2;
                        for ( o = 0; o < lpc_samples; o++ )
                        {
                            lpc_input[ o ] = s8[ o * 2 + 0 ];
                            lpc_input[ o + lpc_max ] = s8[ o * 2 + 1 ];
                        }
                    }

                    vorbis_lpc_from_data( lpc_input, lpc, lpc_samples, lpc_order );
                    vorbis_lpc_from_data( lpc_input + lpc_max, lpc + lpc_order, lpc_samples, lpc_order );

                    vorbis_lpc_predict( lpc, lpc_input + lpc_samples - lpc_order, lpc_order, lpc_output, lpc_extra );
                    vorbis_lpc_predict( lpc + lpc_order, lpc_input + lpc_max + lpc_samples - lpc_order, lpc_order, lpc_output + lpc_extra, lpc_extra );

                    if ( sample->flags & IT_SAMPLE_16BIT )
                    {
                        s16 = ( signed short * ) realloc( sample->data, ( sample->length + lpc_extra ) * 2 * sizeof(short) );
                        sample->data = s16;

                        s16 += sample->length * 2;
                        sample->length += lpc_extra;

                        for ( o = 0; o < lpc_extra; o++ )
                        {
                            s16[ o * 2 + 0 ] = (signed short)lpc_output[ o ];
                            s16[ o * 2 + 1 ] = (signed short)lpc_output[ o + lpc_extra ];
                        }
                    }
                    else
                    {
                        s8 = ( signed char * ) realloc( sample->data, ( sample->length + lpc_extra ) * 2 );
                        sample->data = s8;

                        s8 += sample->length * 2;
                        sample->length += lpc_extra;

                        for ( o = 0; o < lpc_extra; o++ )
                        {
                            s8[ o * 2 + 0 ] = (signed char)lpc_output[ o ];
                            s8[ o * 2 + 1 ] = (signed char)lpc_output[ o + lpc_extra ];
                        }
                    }
                }
                else
                {
                    if ( sample->flags & IT_SAMPLE_16BIT )
                    {
                        s16 = ( signed short * ) sample->data;
                        s16 += offset;
                        for ( o = 0; o < lpc_samples; o++ )
                        {
                            lpc_input[ o ] = s16[ o ];
                        }
                    }
                    else
                    {
                        s8 = ( signed char * ) sample->data;
                        s8 += offset;
                        for ( o = 0; o < lpc_samples; o++ )
                        {
                            lpc_input[ o ] = s8[ o ];
                        }
                    }

                    vorbis_lpc_from_data( lpc_input, lpc, lpc_samples, lpc_order );

                    vorbis_lpc_predict( lpc, lpc_input + lpc_samples - lpc_order, lpc_order, lpc_output, lpc_extra );

                    if ( sample->flags & IT_SAMPLE_16BIT )
                    {
                        s16 = ( signed short * ) realloc( sample->data, ( sample->length + lpc_extra ) * sizeof(short) );
                        sample->data = s16;

                        s16 += sample->length;
                        sample->length += lpc_extra;

                        for ( o = 0; o < lpc_extra; o++ )
                        {
                            s16[ o ] = (signed short)lpc_output[ o ];
                        }
                    }
                    else
                    {
                        s8 = ( signed char * ) realloc( sample->data, sample->length + lpc_extra );
                        sample->data = s8;

                        s8 += sample->length;
                        sample->length += lpc_extra;

                        for ( o = 0; o < lpc_extra; o++ )
                        {
                            s8[ o ] = (signed char)lpc_output[ o ];
                        }
                    }
                }
            }
            else
            /* Otherwise, pad with silence. */
            {
                offset = sample->length;
                lpc_samples = lpc_extra;

                sample->length += lpc_samples;

                n = 1;
                if ( sample->flags & IT_SAMPLE_STEREO ) n *= 2;
                if ( sample->flags & IT_SAMPLE_16BIT ) n *= 2;

                offset *= n;
                lpc_samples *= n;

                sample->data = realloc( sample->data, offset + lpc_samples );
                memset( (char*)sample->data + offset, 0, lpc_samples );
            }
        }
    }
}